

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools.hpp
# Opt level: O0

bool CLI::detail::valid_later_char<char>(char c)

{
  bool bVar1;
  undefined1 local_a;
  char c_local;
  
  bVar1 = valid_first_char<char>(c);
  local_a = true;
  if ((!bVar1) && (local_a = true, c != '.')) {
    local_a = c == '-';
  }
  return local_a;
}

Assistant:

inline bool valid_name_string(const std::string &str) {
    if(str.empty() || !valid_first_char(str[0]))
        return false;
    for(auto c : str.substr(1))
        if(!valid_later_char(c))
            return false;
    return true;
}